

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cc
# Opt level: O3

__pid_t __thiscall muduo::CountDownLatch::wait(CountDownLatch *this,void *__stat_loc)

{
  int iVar1;
  
  MutexLock::lock(&this->mutex_);
  while (0 < this->count_) {
    Condition::wait(&this->condition_,__stat_loc);
  }
  (this->mutex_).holder_ = 0;
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return iVar1;
}

Assistant:

void CountDownLatch::wait()
{
  MutexLockGuard lock(mutex_);
  while (count_ > 0)
  {
    condition_.wait();
  }
}